

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::IsTypedArrayConstructor(Var constructor,ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  bool bVar2;
  
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  bVar2 = true;
  if ((((((pJVar1->super_JavascriptLibraryBase).Int8ArrayConstructor.ptr !=
          (RuntimeFunction *)constructor) &&
        ((pJVar1->super_JavascriptLibraryBase).Uint8ArrayConstructor.ptr !=
         (RuntimeFunction *)constructor)) &&
       ((pJVar1->super_JavascriptLibraryBase).Uint8ClampedArrayConstructor.ptr !=
        (RuntimeFunction *)constructor)) &&
      (((pJVar1->super_JavascriptLibraryBase).Int16ArrayConstructor.ptr !=
        (RuntimeFunction *)constructor &&
       ((pJVar1->super_JavascriptLibraryBase).Uint16ArrayConstructor.ptr !=
        (RuntimeFunction *)constructor)))) &&
     (((pJVar1->super_JavascriptLibraryBase).Int32ArrayConstructor.ptr !=
       (RuntimeFunction *)constructor &&
      (((pJVar1->super_JavascriptLibraryBase).Uint32ArrayConstructor.ptr !=
        (RuntimeFunction *)constructor &&
       ((pJVar1->super_JavascriptLibraryBase).Float32ArrayConstructor.ptr !=
        (RuntimeFunction *)constructor)))))) {
    bVar2 = (pJVar1->super_JavascriptLibraryBase).Float64ArrayConstructor.ptr ==
            (RuntimeFunction *)constructor;
  }
  return bVar2;
}

Assistant:

bool JavascriptLibrary::IsTypedArrayConstructor(Var constructor, ScriptContext* scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();
        return constructor == library->GetInt8ArrayConstructor()
            || constructor == library->GetUint8ArrayConstructor()
            || constructor == library->GetUint8ClampedArrayConstructor()
            || constructor == library->GetInt16ArrayConstructor()
            || constructor == library->GetUint16ArrayConstructor()
            || constructor == library->GetInt32ArrayConstructor()
            || constructor == library->GetUint32ArrayConstructor()
            || constructor == library->GetFloat32ArrayConstructor()
            || constructor == library->GetFloat64ArrayConstructor();
    }